

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O0

logical pnga_create_config(Integer type,Integer ndim,Integer *dims,char *array_name,Integer *chunk,
                          Integer p_handle,Integer *g_a)

{
  Integer g_a_00;
  logical lVar1;
  Integer in_RCX;
  Integer in_R8;
  Integer *in_R9;
  Integer g_A;
  logical status;
  Integer in_stack_00000520;
  char *in_stack_ffffffffffffffb8;
  Integer *in_stack_ffffffffffffffc8;
  
  g_a_00 = pnga_create_handle();
  *(Integer *)g_A = g_a_00;
  pnga_set_data(in_RCX,in_R8,in_R9,(Integer)in_stack_ffffffffffffffc8);
  pnga_set_array_name(g_a_00,in_stack_ffffffffffffffb8);
  pnga_set_chunk((Integer)in_R9,in_stack_ffffffffffffffc8);
  pnga_set_pgroup(g_a_00,(Integer)in_stack_ffffffffffffffb8);
  lVar1 = pnga_allocate(in_stack_00000520);
  return lVar1;
}

Assistant:

logical pnga_create_config(Integer type,
                         Integer ndim,
                         Integer dims[],
                         char* array_name,
                         Integer *chunk,
                         Integer p_handle,
                         Integer *g_a)
{
  logical status;
  Integer g_A;
  g_A = pnga_create_handle();
  *g_a = g_A;
  pnga_set_data(g_A,ndim,dims,type);
  pnga_set_array_name(g_A,array_name);
  pnga_set_chunk(g_A,chunk);
  pnga_set_pgroup(g_A,p_handle);
  status = pnga_allocate(g_A);
  return status;
}